

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::ServiceDescriptorProto::ByteSizeLong(ServiceDescriptorProto *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  RepeatedPtrField<google::protobuf::MethodDescriptorProto> *this_00;
  reference value;
  uint32_t *puVar4;
  string *value_00;
  size_t sVar5;
  MethodDescriptorProto *msg;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::MethodDescriptorProto> *__range3;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  ServiceDescriptorProto *this_;
  ServiceDescriptorProto *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar3 = _internal_method_size(this);
  sStack_58 = (size_t)iVar3;
  this_00 = _internal_method(this);
  __end3 = RepeatedPtrField<google::protobuf::MethodDescriptorProto>::begin(this_00);
  msg = (MethodDescriptorProto *)
        RepeatedPtrField<google::protobuf::MethodDescriptorProto>::end(this_00);
  while (bVar2 = internal::operator!=(&__end3,(iterator *)&msg), bVar2) {
    value = internal::RepeatedPtrIterator<const_google::protobuf::MethodDescriptorProto>::operator*
                      (&__end3);
    sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::MethodDescriptorProto>(value);
    sStack_58 = sVar5 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::MethodDescriptorProto>::operator++
              (&__end3);
  }
  puVar4 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar4;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      value_00 = _internal_name_abi_cxx11_(this);
      sVar5 = internal::WireFormatLite::StringSize(value_00);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::ServiceOptions>
                        ((this->field_0)._impl_.options_);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t ServiceDescriptorProto::ByteSizeLong() const {
  const ServiceDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.ServiceDescriptorProto)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.MethodDescriptorProto method = 2;
    {
      total_size += 1UL * this_._internal_method_size();
      for (const auto& msg : this_._internal_method()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // optional string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name());
    }
    // optional .google.protobuf.ServiceOptions options = 3;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}